

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

PktOut * ssh_new_packet(void)

{
  PktOut *pPVar1;
  
  pPVar1 = (PktOut *)safemalloc(1,0x78,0);
  pPVar1->binarysink_[0].write = ssh_pkt_BinarySink_write;
  pPVar1->binarysink_[0].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
  pPVar1->binarysink_[0].binarysink_ = pPVar1->binarysink_;
  pPVar1->length = 0;
  (pPVar1->qnode).on_free_queue = false;
  pPVar1->data = (uchar *)0x0;
  pPVar1->maxlen = 0;
  pPVar1->downstream_id = 0;
  pPVar1->additional_log_text = (char *)0x0;
  (pPVar1->qnode).next = (PacketQueueNode *)0x0;
  (pPVar1->qnode).prev = (PacketQueueNode *)0x0;
  return pPVar1;
}

Assistant:

PktOut *ssh_new_packet(void)
{
    PktOut *pkt = snew(PktOut);

    BinarySink_INIT(pkt, ssh_pkt_BinarySink_write);
    pkt->data = NULL;
    pkt->length = 0;
    pkt->maxlen = 0;
    pkt->downstream_id = 0;
    pkt->additional_log_text = NULL;
    pkt->qnode.next = pkt->qnode.prev = NULL;
    pkt->qnode.on_free_queue = false;

    return pkt;
}